

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this)

{
  Preset *this_local;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_00f4b0e0;
  std::__cxx11::string::string((string *)&this->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Inherits);
  this->Hidden = false;
  std::__cxx11::string::string((string *)&this->DisplayName);
  std::__cxx11::string::string((string *)&this->Description);
  std::shared_ptr<cmCMakePresetsGraph::Condition>::shared_ptr(&this->ConditionEvaluator);
  this->ConditionResult = true;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map(&this->Environment);
  return;
}

Assistant:

Preset() = default;